

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O2

void __thiscall
Pubkey_ConstructorExceptionTest_Test::TestBody(Pubkey_ConstructorExceptionTest_Test *this)

{
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"",&local_a9);
  pubkeyExceptionTest(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_48,"1234567890",&local_a9);
  pubkeyExceptionTest(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"ABCDEFGHIJKLMN",&local_a9);
  pubkeyExceptionTest(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string
            ((string *)&local_88,
             "011362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",&local_a9);
  pubkeyExceptionTest(&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_a8,
             "021362zzz255z304zzz29zzzz6z5z63z68zz7zz60z2z1zz156716zzz077z794647",&local_a9);
  pubkeyExceptionTest(&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

TEST(Pubkey, ConstructorExceptionTest) {
  pubkeyExceptionTest("");
  pubkeyExceptionTest("1234567890");
  pubkeyExceptionTest("ABCDEFGHIJKLMN");
  pubkeyExceptionTest(
      "011362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647");
  pubkeyExceptionTest(
      "021362zzz255z304zzz29zzzz6z5z63z68zz7zz60z2z1zz156716zzz077z794647");
}